

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_picker.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::hash_picker::verify_block_hashes(hash_picker *this,piece_index_t index)

{
  file_index_t f;
  piece_index_t pVar1;
  __normal_iterator<libtorrent::aux::hash_picker::piece_block_request_*,_std::vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>_>
  _Var2;
  piece_block_request req;
  value_type local_30;
  
  f = file_storage::file_index_at_piece(this->m_files,index);
  pVar1 = file_storage::piece_index_at_file(this->m_files,f);
  local_30.piece.m_val = index.m_val - pVar1.m_val;
  local_30.last_request.__d.__r = (duration)-0x8000000000000000;
  local_30.num_requests = 0;
  local_30.file = f;
  _Var2 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::hash_picker::piece_block_request*,std::vector<libtorrent::aux::hash_picker::piece_block_request,std::allocator<libtorrent::aux::hash_picker::piece_block_request>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::hash_picker::piece_block_request_const>>
                    ((this->m_piece_block_requests).
                     super_vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
                     .
                     super__Vector_base<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_piece_block_requests).
                     super_vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
                     .
                     super__Vector_base<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var2._M_current ==
      (this->m_piece_block_requests).
      super_vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
      .
      super__Vector_base<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::
    vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
    ::insert(&(this->m_piece_block_requests).
              super_vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
             ,(this->m_piece_block_requests).
              super_vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
              .
              super__Vector_base<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
              ._M_impl.super__Vector_impl_data._M_start,&local_30);
  }
  return;
}

Assistant:

void hash_picker::verify_block_hashes(piece_index_t const index)
	{
		file_index_t const fidx = m_files.file_index_at_piece(index);
		piece_index_t::diff_type const piece = index - m_files.piece_index_at_file(fidx);
		piece_block_request req(fidx, piece);

		if (std::find(m_piece_block_requests.begin(), m_piece_block_requests.end(), req)
			!= m_piece_block_requests.end())
			return; // already requested

		m_piece_block_requests.insert(m_piece_block_requests.begin(), req);
	}